

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O2

void printError(uint32_t lineno,string *error)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&g_Options);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::operator<<(poVar1,(string *)error);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printError(uint32_t lineno, const string& error)
{
	cerr << g_Options.inputFile << "(" << lineno << "): " << error << endl;
}